

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  string *psVar2;
  ulong uVar3;
  exception *e;
  test_app app;
  service srv;
  service srv_2;
  service srv_1;
  value cfg;
  test_app *in_stack_00001510;
  test_app *in_stack_00001c10;
  test_app *in_stack_00003880;
  undefined1 in_stack_00003a1f;
  service *in_stack_00003a20;
  value *in_stack_fffffffffffffdb8;
  test_app *in_stack_fffffffffffffdc0;
  char (*in_stack_fffffffffffffdc8) [12];
  value *in_stack_fffffffffffffdd0;
  allocator *srv_00;
  service local_f0 [8];
  service local_e8 [15];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89;
  service local_80 [15];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [40];
  value local_20 [3];
  undefined4 local_4;
  
  local_4 = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"- Basics no throw");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  cppcms::json::value::value((value *)0x131062);
  cppcms::json::value::value<char[12]>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  srv_00 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"localization",srv_00);
  psVar2 = (string *)cppcms::json::value::operator[]((string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"locales",&local_71);
  uVar3 = cppcms::json::value::operator[](psVar2);
  cppcms::json::value::operator[](uVar3);
  cppcms::json::value::operator=((value *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cppcms::json::value::~value((value *)0x131173);
  cppcms::service::service(local_80,local_20);
  basic_test(in_stack_00003a20,(bool)in_stack_00003a1f);
  cppcms::service::~service(local_80);
  local_89 = 1;
  cppcms::json::value::value<bool>(in_stack_fffffffffffffdd0,(bool *)in_stack_fffffffffffffdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"misc",&local_b1);
  psVar2 = (string *)cppcms::json::value::operator[]((string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"invalid_url_throws",&local_d9);
  cppcms::json::value::operator[](psVar2);
  cppcms::json::value::operator=((value *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cppcms::json::value::~value((value *)0x1312ab);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Basics throw");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  cppcms::service::service(local_e8,local_20);
  basic_test(in_stack_00003a20,(bool)in_stack_00003a1f);
  cppcms::service::~service(local_e8);
  cppcms::service::service(local_f0,local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Hierarchy ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  test_app::test_app((test_app *)app._0_8_,(service *)e);
  test_app::test_hierarchy(in_stack_00001c10);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Mappting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  test_app::test_mapping(in_stack_00003880);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Keyword substitution");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  test_app::test_keywords(in_stack_00001510);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Dispatcher Test");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dispatcher_test((service *)srv_00);
  test_app::~test_app(in_stack_fffffffffffffdc0);
  cppcms::service::~service(local_f0);
  cppcms::json::value::~value((value *)0x131455);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	try {


		std::cout << "- Basics no throw" << std::endl;

		cppcms::json::value cfg;
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		{
			cppcms::service srv(cfg);
			basic_test(srv,false);
		}

		cfg["misc"]["invalid_url_throws"]=true;
		std::cout << "- Basics throw" << std::endl;

		{
			cppcms::service srv(cfg);
			basic_test(srv,true);
		}

		cppcms::service srv(cfg);
		
		std::cout << "- Hierarchy " << std::endl;
		test_app app(srv);

		app.test_hierarchy();

		std::cout << "- Mappting" << std::endl;
		app.test_mapping();
		std::cout << "- Keyword substitution" << std::endl;
		app.test_keywords();

		std::cout << "- Dispatcher Test" << std::endl;
		dispatcher_test(srv);

	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "ok" << std::endl;
	return 0;
}